

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall
despot::Function::Function
          (Function *this,NamedVar *child,
          vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents)

{
  size_type sVar1;
  reference ppNVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  reference this_00;
  int local_38;
  int i_1;
  int local_28;
  int local_24;
  int i;
  int parent_size;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents_local;
  NamedVar *child_local;
  Function *this_local;
  
  this->_vptr_Function = (_func_int **)&PTR__Function_0026e728;
  this->child_ = child;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            (&this->parents_,parents);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->values_);
  std::
  vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
  ::vector(&this->map_);
  local_24 = 1;
  for (local_28 = 0;
      sVar1 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::size(parents),
      (ulong)(long)local_28 < sVar1; local_28 = local_28 + 1) {
    ppNVar2 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                        (parents,(long)local_28);
    pvVar3 = Variable::values_abi_cxx11_(&(*ppNVar2)->super_Variable);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar3);
    local_24 = local_24 * (int)sVar1;
  }
  pvVar3 = Variable::values_abi_cxx11_(&child->super_Variable);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(pvVar3);
  if (sVar1 < 100) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&this->values_,(long)local_24);
    for (local_38 = 0; local_38 < local_24; local_38 = local_38 + 1) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->values_,(long)local_38);
      pvVar3 = Variable::values_abi_cxx11_(&child->super_Variable);
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar3);
      std::vector<double,_std::allocator<double>_>::resize(this_00,sVar1);
    }
  }
  else {
    std::
    vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
    ::resize(&this->map_,(long)local_24);
  }
  return;
}

Assistant:

Function::Function(NamedVar* child, vector<NamedVar*> parents) :
	child_(child),
	parents_(parents) {
	int parent_size = 1;
	for (int i = 0; i < parents.size(); i++)
		parent_size *= parents[i]->values().size();

	if (child->values().size() < 100) { // TODO: possible refactoring to use a single data structure
		values_.resize(parent_size);
		for (int i = 0; i < parent_size; i++)
			values_[i].resize(child->values().size());
	} else {
		map_.resize(parent_size);
	}
	// cout << "size " << values_.size() << " " << values_[0].size() << endl;
}